

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstral_analysis.cc
# Opt level: O1

bool __thiscall
sptk::MelCepstralAnalysis::Run
          (MelCepstralAnalysis *this,vector<double,_std::allocator<double>_> *periodogram,
          vector<double,_std::allocator<double>_> *mel_cepstrum,Buffer *buffer)

{
  int iVar1;
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *imag_part_output;
  vector<double,_std::allocator<double>_> *real_part_output;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *real_part_output_00;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_type sVar8;
  double *pdVar9;
  int iVar10;
  pointer pdVar11;
  size_type __new_size_00;
  size_t sVar12;
  pointer pdVar13;
  long lVar14;
  double *pdVar15;
  size_type __new_size_01;
  pointer pdVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double local_e8;
  value_type_conflict local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if ((buffer != (Buffer *)0x0) && (mel_cepstrum != (vector<double,_std::allocator<double>_> *)0x0))
  {
    uVar2 = this->fft_length_;
    iVar1 = (int)uVar2 / 2 + 1;
    __new_size_00 = (size_type)iVar1;
    if ((long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == __new_size_00) {
      iVar3 = this->num_order_;
      lVar7 = (long)iVar3;
      __new_size = lVar7 + 1;
      if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(mel_cepstrum,__new_size);
      }
      if ((long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size_00) {
        std::vector<double,_std::allocator<double>_>::resize
                  (&buffer->log_periodogram_,__new_size_00);
      }
      this_00 = &buffer->cepstrum_;
      if ((long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
      }
      this_01 = &buffer->rt_;
      iVar10 = (int)__new_size * 2 + -1;
      __new_size_01 = (size_type)iVar10;
      if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size_01) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
      }
      this_02 = &buffer->rr_;
      if ((long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size_01) {
        std::vector<double,_std::allocator<double>_>::resize(this_02,__new_size_01);
      }
      this_03 = &buffer->ra_;
      if ((long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_03,__new_size);
      }
      this_04 = &buffer->gradient_;
      if ((long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_04,__new_size);
      }
      pdVar9 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar9 != pdVar4) {
        pdVar16 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          dVar19 = log(*pdVar9);
          *pdVar16 = dVar19;
          pdVar9 = pdVar9 + 1;
          pdVar16 = pdVar16 + 1;
        } while (pdVar9 != pdVar4);
      }
      pdVar16 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar12 = (long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar16;
      if (sVar12 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar16,sVar12);
      }
      pdVar16 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start + 1;
      pdVar11 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
      lVar17 = (long)((int)uVar2 / 2);
      if (pdVar11 != pdVar16) {
        pdVar13 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar17;
        do {
          pdVar13 = pdVar13 + 1;
          pdVar9 = pdVar11 + -1;
          pdVar11 = pdVar11 + -1;
          *pdVar13 = *pdVar9;
        } while (pdVar11 != pdVar16);
      }
      imag_part_output = &buffer->imag_part_output_;
      bVar5 = RealValuedInverseFastFourierTransform::Run
                        (&this->inverse_fourier_transform_,this_00,this_00,imag_part_output,
                         &buffer->buffer_for_inverse_fourier_transform_);
      if (bVar5) {
        pdVar9 = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar9 = *pdVar9 * 0.5;
        pdVar9[lVar17] = pdVar9[lVar17] * 0.5;
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
        bVar5 = FrequencyTransform::Run
                          (&this->frequency_transform_,this_00,mel_cepstrum,
                           &buffer->buffer_for_frequency_transform_);
        if (bVar5) {
          if (this->num_iteration_ < 1) {
            return true;
          }
          real_part_output = &buffer->d_;
          real_part_output_00 = &buffer->r_;
          local_e8 = 1.79769313486232e+308;
          iVar6 = 0;
          while( true ) {
            std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
            bVar5 = FrequencyTransform::Run
                              (&this->inverse_frequency_transform_,mel_cepstrum,this_00,
                               &buffer->buffer_for_inverse_frequency_transform_);
            if (!bVar5) {
              return false;
            }
            local_50 = 0.0;
            std::vector<double,_std::allocator<double>_>::resize
                      (this_00,(long)this->fft_length_,&local_50);
            bVar5 = RealValuedFastFourierTransform::Run
                              (&this->fourier_transform_,this_00,real_part_output,imag_part_output,
                               &buffer->buffer_for_fourier_transform_);
            if (!bVar5) {
              return false;
            }
            pdVar9 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (pdVar9 != pdVar4) {
              pdVar15 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                dVar19 = exp((*pdVar9 - *pdVar15) - *pdVar15);
                *pdVar15 = dVar19;
                pdVar9 = pdVar9 + 1;
                pdVar15 = pdVar15 + 1;
              } while (pdVar9 != pdVar4);
            }
            if ((uVar2 & 0xfffffffe) != 2) {
              pdVar16 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pdVar11 = pdVar16 + lVar17 + 1;
              lVar14 = lVar17 * 8 + -8;
              do {
                *pdVar11 = *(double *)((long)pdVar16 + lVar14);
                pdVar11 = pdVar11 + 1;
                lVar14 = lVar14 + -8;
              } while (lVar14 != 0);
            }
            bVar5 = RealValuedInverseFastFourierTransform::Run
                              (&this->inverse_fourier_transform_,real_part_output,
                               real_part_output_00,imag_part_output,
                               &buffer->buffer_for_inverse_fourier_transform_);
            if (!bVar5) {
              return false;
            }
            dVar19 = this->alpha_;
            if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3 != __new_size_01) {
              std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
            }
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              if ((long)(buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3 != __new_size_01) {
                std::vector<double,_std::allocator<double>_>::resize(&buffer->b_,__new_size_01);
              }
              pdVar16 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pdVar9 = (buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar11 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              memset(pdVar11,0,__new_size_01 * 8);
              sVar8 = __new_size_00;
              if (-2 < (int)uVar2) {
                do {
                  *pdVar9 = *pdVar11;
                  *pdVar11 = pdVar16[sVar8 - 1];
                  if (0 < iVar3) {
                    uVar18 = 0;
                    do {
                      dVar20 = pdVar11[uVar18 + 1];
                      pdVar9[uVar18 + 1] = dVar20;
                      pdVar11[uVar18 + 1] = (dVar20 - pdVar11[uVar18]) * dVar19 + pdVar9[uVar18];
                      uVar18 = uVar18 + 1;
                    } while ((uint)(iVar3 * 2) != uVar18);
                  }
                  bVar5 = 1 < (long)sVar8;
                  sVar8 = sVar8 - 1;
                } while (bVar5);
              }
            }
            else {
              pdVar16 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if (iVar1 < iVar10) {
                sVar12 = (long)(buffer->r_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar16;
                if (sVar12 != 0) {
                  memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start,pdVar16,sVar12);
                }
                pdVar11 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar13 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                pdVar16 = pdVar11 + __new_size_00;
                if (pdVar16 != pdVar13) {
                  memset(pdVar16,0,
                         (long)pdVar13 - (long)(pdVar11 + __new_size_00) & 0xfffffffffffffff8);
                }
              }
              else {
                memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start,pdVar16,__new_size_01 * 8);
              }
            }
            pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_48 = *pdVar9;
            dVar20 = ABS((local_48 - local_e8) / local_48);
            dVar19 = this->convergence_threshold_;
            if (dVar20 < dVar19) break;
            uStack_40 = 0;
            pdVar16 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar14 = lVar7 * 8;
            pdVar11 = pdVar16;
            if (iVar3 != 0) {
              do {
                *pdVar11 = *(double *)((long)pdVar9 + lVar14);
                lVar14 = lVar14 + -8;
                pdVar11 = pdVar11 + 1;
              } while (lVar14 != 0);
            }
            if ((int)__new_size != 0) {
              memmove(pdVar16 + lVar7,pdVar9,__new_size * 8);
              pdVar16 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar11 = (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13 = (this->alpha_vector_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar14 = 0;
              do {
                *(double *)((long)pdVar11 + lVar14) =
                     *(double *)((long)pdVar16 + lVar14) - *(double *)((long)pdVar13 + lVar14);
                lVar14 = lVar14 + 8;
              } while (__new_size * 8 - lVar14 != 0);
            }
            bVar5 = ToeplitzPlusHankelSystemSolver::Run
                              (&this->toeplitz_plus_hankel_system_solver_,this_02,this_01,this_03,
                               this_04,&buffer->buffer_for_system_solver_);
            if (!bVar5) {
              return false;
            }
            pdVar9 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar9 != pdVar4) {
              pdVar15 = (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                *pdVar9 = *pdVar9 + *pdVar15;
                pdVar9 = pdVar9 + 1;
                pdVar15 = pdVar15 + 1;
              } while (pdVar9 != pdVar4);
            }
            uVar18 = -(ulong)(dVar19 <= dVar20);
            local_e8 = (double)(~uVar18 & (ulong)local_e8 | (ulong)local_48 & uVar18);
            iVar6 = iVar6 + 1;
            if (this->num_iteration_ <= iVar6) {
              return true;
            }
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool MelCepstralAnalysis::Run(const std::vector<double>& periodogram,
                              std::vector<double>* mel_cepstrum,
                              MelCepstralAnalysis::Buffer* buffer) const {
  // Check inputs.
  const int half_fft_length(fft_length_ / 2);
  if (!is_valid_ ||
      periodogram.size() != static_cast<std::size_t>(half_fft_length + 1) ||
      NULL == mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int length(num_order_ + 1);
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }
  if (buffer->log_periodogram_.size() !=
      static_cast<std::size_t>(half_fft_length + 1)) {
    buffer->log_periodogram_.resize(half_fft_length + 1);
  }
  if (buffer->cepstrum_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->cepstrum_.resize(fft_length_);
  }
  if (buffer->rt_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rt_.resize(2 * length - 1);
  }
  if (buffer->rr_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rr_.resize(2 * length - 1);
  }
  if (buffer->ra_.size() != static_cast<std::size_t>(length)) {
    buffer->ra_.resize(length);
  }
  if (buffer->gradient_.size() != static_cast<std::size_t>(length)) {
    buffer->gradient_.resize(length);
  }

  // Make an initial guess.
  {
    std::transform(periodogram.begin(), periodogram.end(),
                   buffer->log_periodogram_.begin(),
                   [](double p) { return std::log(p); });

    // \log I_N -> c
    std::copy(buffer->log_periodogram_.begin(), buffer->log_periodogram_.end(),
              buffer->cepstrum_.begin());
    std::reverse_copy(buffer->log_periodogram_.begin() + 1,
                      buffer->log_periodogram_.end() - 1,
                      buffer->cepstrum_.begin() + half_fft_length + 1);
    if (!inverse_fourier_transform_.Run(
            buffer->cepstrum_, &buffer->cepstrum_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }
    buffer->cepstrum_[0] *= 0.5;
    buffer->cepstrum_[half_fft_length] *= 0.5;

    // c -> \tilde{c}
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!frequency_transform_.Run(buffer->cepstrum_, mel_cepstrum,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
  }

  // Perform Newton-Raphson method.
  double prev_epsilon(sptk::kMax);
  for (int n(0); n < num_iteration_; ++n) {
    // \tilde{c} -> c
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!inverse_frequency_transform_.Run(
            *mel_cepstrum, &buffer->cepstrum_,
            &buffer->buffer_for_inverse_frequency_transform_)) {
      return false;
    }

    // c -> \log D
    buffer->cepstrum_.resize(fft_length_, 0.0);
    if (!fourier_transform_.Run(buffer->cepstrum_, &buffer->d_,
                                &buffer->imag_part_output_,
                                &buffer->buffer_for_fourier_transform_)) {
      return false;
    }

    // \log D -> I_N / |D|^2
    std::transform(buffer->log_periodogram_.begin(),
                   buffer->log_periodogram_.end(), buffer->d_.begin(),
                   buffer->d_.begin(),
                   [](double x, double d) { return std::exp(x - d - d); });
    std::reverse_copy(buffer->d_.begin() + 1,
                      buffer->d_.begin() + half_fft_length,
                      buffer->d_.begin() + half_fft_length + 1);

    // I_N / |D|^2 -> r
    if (!inverse_fourier_transform_.Run(
            buffer->d_, &buffer->r_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }

    // r -> \tilde{r}
    CoefficientsFrequencyTransform(buffer->r_, half_fft_length + 1,
                                   2 * length - 1, alpha_, &buffer->rt_,
                                   &buffer->b_);

    // Check convergence.
    // (Note that the check can be done after updating mel-cepstrum, but to
    // retain the compatibility with SPTK3, this block is written here)
    {
      const double epsilon(buffer->rt_[0]);
      const double relative_change((epsilon - prev_epsilon) / epsilon);
      if (std::fabs(relative_change) < convergence_threshold_) {
        break;
      }
      prev_epsilon = epsilon;
    }

    // \tilde{r} -> R
    std::reverse_copy(buffer->rt_.begin() + 1, buffer->rt_.begin() + length,
                      buffer->rr_.begin());
    std::copy(buffer->rt_.begin(), buffer->rt_.begin() + length,
              buffer->rr_.begin() + length - 1);

    // \tilde{r} -> \tilde{r} - a
    std::transform(buffer->rt_.begin(), buffer->rt_.begin() + length,
                   alpha_vector_.begin(), buffer->ra_.begin(),
                   std::minus<double>());

    // Compute \Delta \tilde{c}.
    if (!toeplitz_plus_hankel_system_solver_.Run(
            buffer->rr_, buffer->rt_, buffer->ra_, &buffer->gradient_,
            &buffer->buffer_for_system_solver_)) {
      return false;
    }

    // Update \tilde{c}.
    std::transform(mel_cepstrum->begin(), mel_cepstrum->end(),
                   buffer->gradient_.begin(), mel_cepstrum->begin(),
                   std::plus<double>());
  }

  return true;
}